

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLDateTime::getYearMonth(XMLDateTime *this)

{
  XMLCh XVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  SchemaDateTimeException *this_00;
  long lVar5;
  ulong uVar6;
  XMLSize_t XVar7;
  
  XVar7 = this->fStart;
  uVar2 = this->fEnd;
  if (uVar2 < XVar7 + 7) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4a8,DateTime_ym_incomplete,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    XVar1 = *this->fBuffer;
    uVar6 = (XVar1 == L'-') + XVar7;
    iVar4 = -1;
    if (uVar6 < uVar2) {
      lVar5 = 0;
      do {
        if (this->fBuffer[uVar6 + lVar5] == L'-') {
          iVar4 = (int)lVar5 + (int)XVar7 + (uint)(XVar1 == L'-');
          break;
        }
        lVar5 = lVar5 + 1;
      } while (uVar2 - uVar6 != lVar5);
    }
    if (iVar4 == -1) {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x4b6,DateTime_ym_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
    }
    else {
      XVar7 = (XMLSize_t)iVar4;
      iVar3 = parseIntYear(this,XVar7);
      this->fValue[0] = iVar3;
      this->fStart = XVar7 + 1;
      if (XVar7 + 3 <= this->fEnd) {
        iVar4 = parseInt(this,XVar7 + 1,(long)(iVar4 + 3));
        this->fValue[1] = iVar4;
        this->fStart = this->fStart + 2;
        return;
      }
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x4c3,DateTime_ym_noMonth,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
    }
  }
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::getYearMonth()
{

    // Ensure enough chars in buffer
    if ( (fStart+YMONTH_MIN_SIZE) > fEnd)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_incomplete
                , fBuffer
                , fMemoryManager);
        //"Imcomplete YearMonth Format";

    // skip the first leading '-'
    XMLSize_t start = ( fBuffer[0] == chDash ) ? fStart + 1 : fStart;

    //
    // search for year separator '-'
    //
    int yearSeparator = indexOf(start, fEnd, DATE_SEPARATOR);
    if ( yearSeparator == NOT_FOUND)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_invalid
                , fBuffer
                , fMemoryManager);
        //("Year separator is missing or misplaced");

    fValue[CentYear] = parseIntYear(yearSeparator);
    fStart = yearSeparator + 1;  //skip the '-' and point to the first M

    //
    //gonna check we have enough byte for month
    //
    if ((fStart + 2) > fEnd )
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_noMonth
                , fBuffer
                , fMemoryManager);
        //"no month in buffer"

    fValue[Month] = parseInt(fStart, yearSeparator + 3);
    fStart += 2;  //fStart points right after the MONTH

    return;
}